

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__pnm_info(stbi__context *s,int *x,int *y,int *comp)

{
  stbi_uc sVar1;
  int iVar2;
  undefined8 in_RAX;
  stbi_uc *psVar3;
  long in_FS_OFFSET;
  bool bVar4;
  undefined8 uStack_38;
  char c;
  
  psVar3 = s->img_buffer_original;
  s->img_buffer = psVar3;
  s->img_buffer_end = s->img_buffer_original_end;
  uStack_38 = in_RAX;
  if (psVar3 < s->img_buffer_original_end) {
LAB_0011c153:
    s->img_buffer = psVar3 + 1;
    bVar4 = *psVar3 != 'P';
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar3 = s->img_buffer;
      goto LAB_0011c153;
    }
    bVar4 = true;
  }
  psVar3 = s->img_buffer;
  if (psVar3 < s->img_buffer_end) {
LAB_0011c18e:
    s->img_buffer = psVar3 + 1;
    sVar1 = *psVar3;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar3 = s->img_buffer;
      goto LAB_0011c18e;
    }
    sVar1 = '\0';
  }
  if (!(bool)(~bVar4 & 0xfd < (byte)(sVar1 - 0x37))) {
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    return 0;
  }
  if (comp != (int *)0x0) {
    *comp = (uint)(sVar1 == '6') * 2 + 1;
  }
  psVar3 = s->img_buffer;
  if (s->img_buffer_end <= psVar3) {
    if (s->read_from_callbacks == 0) {
      sVar1 = '\0';
      goto LAB_0011c20c;
    }
    stbi__refill_buffer(s);
    psVar3 = s->img_buffer;
  }
  s->img_buffer = psVar3 + 1;
  sVar1 = *psVar3;
LAB_0011c20c:
  uStack_38 = CONCAT17(sVar1,(undefined7)uStack_38);
  stbi__pnm_skip_whitespace(s,(char *)((long)&uStack_38 + 7));
  iVar2 = stbi__pnm_getinteger(s,(char *)((long)&uStack_38 + 7));
  if (x != (int *)0x0) {
    *x = iVar2;
  }
  stbi__pnm_skip_whitespace(s,(char *)((long)&uStack_38 + 7));
  iVar2 = stbi__pnm_getinteger(s,(char *)((long)&uStack_38 + 7));
  if (y != (int *)0x0) {
    *y = iVar2;
  }
  stbi__pnm_skip_whitespace(s,(char *)((long)&uStack_38 + 7));
  iVar2 = stbi__pnm_getinteger(s,(char *)((long)&uStack_38 + 7));
  if (0xff < iVar2) {
    *(char **)(in_FS_OFFSET + -0x10) = "max value > 255";
    return 0;
  }
  return 1;
}

Assistant:

static int      stbi__pnm_info(stbi__context *s, int *x, int *y, int *comp)
{
   int maxv, dummy;
   char c, p, t;

   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;

   stbi__rewind(s);

   // Get identifier
   p = (char) stbi__get8(s);
   t = (char) stbi__get8(s);
   if (p != 'P' || (t != '5' && t != '6')) {
       stbi__rewind(s);
       return 0;
   }

   *comp = (t == '6') ? 3 : 1;  // '5' is 1-component .pgm; '6' is 3-component .ppm

   c = (char) stbi__get8(s);
   stbi__pnm_skip_whitespace(s, &c);

   *x = stbi__pnm_getinteger(s, &c); // read width
   stbi__pnm_skip_whitespace(s, &c);

   *y = stbi__pnm_getinteger(s, &c); // read height
   stbi__pnm_skip_whitespace(s, &c);

   maxv = stbi__pnm_getinteger(s, &c);  // read max value

   if (maxv > 255)
      return stbi__err("max value > 255", "PPM image not 8-bit");
   else
      return 1;
}